

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.hh
# Opt level: O3

void __thiscall
tchecker::ts::
lasso_path_t<tchecker::zg::zg_t,_tchecker::zg::path::symbolic::node_t,_tchecker::zg::path::symbolic::edge_t>
::lasso_path_t(lasso_path_t<tchecker::zg::zg_t,_tchecker::zg::path::symbolic::node_t,_tchecker::zg::path::symbolic::edge_t>
               *this,shared_ptr<tchecker::zg::zg_t> *ts)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  
  graph::reachability::
  multigraph_t<tchecker::zg::path::symbolic::node_t,_tchecker::zg::path::symbolic::edge_t>::
  multigraph_t((multigraph_t<tchecker::zg::path::symbolic::node_t,_tchecker::zg::path::symbolic::edge_t>
                *)this,0x80);
  (this->
  super_lasso_path_t<tchecker::zg::path::symbolic::node_t,_tchecker::zg::path::symbolic::edge_t>).
  _first._t = (make_shared_t<tchecker::graph::reachability::node_t<tchecker::zg::path::symbolic::node_t,_tchecker::zg::path::symbolic::edge_t>,_unsigned_long,_1UL>
               *)0x0;
  (this->
  super_lasso_path_t<tchecker::zg::path::symbolic::node_t,_tchecker::zg::path::symbolic::edge_t>).
  _loop_root._t =
       (make_shared_t<tchecker::graph::reachability::node_t<tchecker::zg::path::symbolic::node_t,_tchecker::zg::path::symbolic::edge_t>,_unsigned_long,_1UL>
        *)0x0;
  (this->
  super_lasso_path_t<tchecker::zg::path::symbolic::node_t,_tchecker::zg::path::symbolic::edge_t>).
  _has_loop = false;
  (this->
  super_lasso_path_t<tchecker::zg::path::symbolic::node_t,_tchecker::zg::path::symbolic::edge_t>).
  super_multigraph_t<tchecker::zg::path::symbolic::node_t,_tchecker::zg::path::symbolic::edge_t>.
  _vptr_multigraph_t = (_func_int **)&PTR__lasso_path_t_0027fde0;
  (this->_ts).super___shared_ptr<tchecker::zg::zg_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (ts->super___shared_ptr<tchecker::zg::zg_t,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var1 = (ts->super___shared_ptr<tchecker::zg::zg_t,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
           _M_pi;
  (this->_ts).super___shared_ptr<tchecker::zg::zg_t,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  return;
}

Assistant:

lasso_path_t(std::shared_ptr<TS> const & ts) : _ts(ts) {}